

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyDamage.cpp
# Opt level: O0

void __thiscall
DIS::DirectedEnergyDamage::unmarshal(DirectedEnergyDamage *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  DirectedEnergyDamage *this_local;
  
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_recordLength);
  DataStream::operator>>(dataStream,&this->_padding);
  Vector3Float::unmarshal(&this->_damageLocation,dataStream);
  DataStream::operator>>(dataStream,&this->_damageDiameter);
  DataStream::operator>>(dataStream,&this->_temperature);
  DataStream::operator>>(dataStream,&this->_componentIdentification);
  DataStream::operator>>(dataStream,&this->_componentDamageStatus);
  DataStream::operator>>(dataStream,&this->_componentVisualDamageStatus);
  DataStream::operator>>(dataStream,&this->_componentVisualSmokeColor);
  EventIdentifier::unmarshal(&this->_fireEventID,dataStream);
  DataStream::operator>>(dataStream,&this->_padding2);
  return;
}

Assistant:

void DirectedEnergyDamage::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _recordLength;
    dataStream >> _padding;
    _damageLocation.unmarshal(dataStream);
    dataStream >> _damageDiameter;
    dataStream >> _temperature;
    dataStream >> _componentIdentification;
    dataStream >> _componentDamageStatus;
    dataStream >> _componentVisualDamageStatus;
    dataStream >> _componentVisualSmokeColor;
    _fireEventID.unmarshal(dataStream);
    dataStream >> _padding2;
}